

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigWnd.c
# Opt level: O2

Aig_Obj_t * Saig_ObjHasUnlabeledFanout(Aig_Man_t *p,Aig_Obj_t *pObj)

{
  int iFan;
  int iVar1;
  Aig_Obj_t *pObj_00;
  uint uVar2;
  
  if (p->pFanData == (int *)0x0) {
    __assert_fail("p->pFanData",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigWnd.c"
                  ,0x85,"Aig_Obj_t *Saig_ObjHasUnlabeledFanout(Aig_Man_t *, Aig_Obj_t *)");
  }
  iFan = -1;
  uVar2 = 0;
  while( true ) {
    if (*(uint *)&pObj->field_0x18 >> 6 <= uVar2) {
      return (Aig_Obj_t *)0x0;
    }
    if (uVar2 == 0) {
      iFan = Aig_ObjFanout0Int(p,pObj->Id);
    }
    else {
      iFan = Aig_ObjFanoutNext(p,iFan);
    }
    pObj_00 = Aig_ManObj(p,iFan >> 1);
    iVar1 = Saig_ObjIsPo(p,pObj_00);
    if (iVar1 != 0) break;
    uVar2 = uVar2 + 1;
    if (pObj_00->TravId != p->nTravIds) {
      return pObj_00;
    }
  }
  return pObj_00;
}

Assistant:

Aig_Obj_t * Saig_ObjHasUnlabeledFanout( Aig_Man_t * p, Aig_Obj_t * pObj )
{
    Aig_Obj_t * pFanout;
    int iFanout = -1, i;
    Aig_ObjForEachFanout( p, pObj, pFanout, iFanout, i )
        if ( Saig_ObjIsPo(p, pFanout) || !Aig_ObjIsTravIdCurrent(p, pFanout) )
            return pFanout;
    return NULL;
}